

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSlabType::~IfcSlabType(IfcSlabType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x99de58;
  *(undefined8 *)&this->field_0x30 = 0x99df70;
  *(undefined8 *)&this[-1].field_0xd0 = 0x99de80;
  *(undefined8 *)&this[-1].field_0xe0 = 0x99dea8;
  *(undefined8 *)&this[-1].field_0x138 = 0x99ded0;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x99def8;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x99df20;
  *(undefined8 *)this = 0x99df48;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x99e238;
  *(undefined8 *)&this->field_0x30 = 0x99e300;
  *(undefined8 *)&this[-1].field_0xd0 = 0x99e260;
  *(undefined8 *)&this[-1].field_0xe0 = 0x99e288;
  *(undefined8 *)&this[-1].field_0x138 = 0x99e2b0;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x99e2d8;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlabType,_1UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__0099df98);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcSlabType() : Object("IfcSlabType") {}